

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

int lj_cdata_get(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  CTypeID local_9c;
  uint8_t *puStack_98;
  CTypeID sid;
  uint8_t *sp_local;
  TValue *o_local;
  CType *s_local;
  CTState *cts_local;
  
  if (s->info >> 0x1c == 0xb) {
    cdata_getconst(cts,o,s);
    cts_local._0_4_ = 0;
  }
  else if (s->info >> 0x1c == 10) {
    cts_local._0_4_ = lj_cconv_tv_bf(cts,s,o,sp);
  }
  else {
    local_9c = s->info & 0xffff;
    o_local = (TValue *)(cts->tab + local_9c);
    puStack_98 = sp;
    if (((o_local->u32).lo & 0xf0800000) == 0x20800000) {
      puStack_98 = *(uint8_t **)sp;
      local_9c = (o_local->u32).lo & 0xffff;
      o_local = (TValue *)(cts->tab + local_9c);
    }
    for (; (o_local->u32).lo >> 0x1c == 8;
        o_local = (TValue *)(cts->tab + ((o_local->u32).lo & 0xffff))) {
    }
    cts_local._0_4_ = lj_cconv_tv_ct(cts,(CType *)&o_local->gcr,local_9c,o,puStack_98);
  }
  return (int)cts_local;
}

Assistant:

int lj_cdata_get(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTypeID sid;

  if (ctype_isconstval(s->info)) {
    cdata_getconst(cts, o, s);
    return 0;  /* No GC step needed. */
  } else if (ctype_isbitfield(s->info)) {
    return lj_cconv_tv_bf(cts, s, o, sp);
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(s->info) || ctype_isfield(s->info),
	       "pointer or field expected");
  sid = ctype_cid(s->info);
  s = ctype_get(cts, sid);

  /* Resolve reference for field. */
  if (ctype_isref(s->info)) {
    lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
    sp = *(uint8_t **)sp;
    sid = ctype_cid(s->info);
    s = ctype_get(cts, sid);
  }

  /* Skip attributes. */
  while (ctype_isattrib(s->info))
    s = ctype_child(cts, s);

  return lj_cconv_tv_ct(cts, s, sid, o, sp);
}